

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O0

void __thiscall
duckdb::DbpDecoder::GetBatchInternal<int,true>
          (DbpDecoder *this,data_ptr_t target_values_ptr,idx_t batch_size)

{
  data_ptr_t pdVar1;
  unsigned_long uVar2;
  uint64_t uVar3;
  ulong in_RDX;
  ByteBuffer *in_RDI;
  bool bVar4;
  idx_t unaff_retaddr;
  unsigned_long *in_stack_00000008;
  ByteBuffer *in_stack_00000010;
  int current_value;
  uint64_t *unpacked_value;
  idx_t i;
  idx_t next;
  idx_t target_values_offset;
  int *target_values;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  ByteBuffer *in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong local_28;
  ByteBuffer *pBVar5;
  
  if (in_RDX != 0) {
    bVar4 = (in_RDI[3].len & 1) != 0;
    if (bVar4) {
      *(undefined1 *)&in_RDI[3].len = 0;
    }
    local_28 = (ulong)bVar4;
    pBVar5 = in_RDI;
    while (local_28 < in_RDX) {
      uVar2 = MinValue<unsigned_long>(in_RDX - local_28,0x20 - in_RDI[0x16].len);
      if (uVar2 == 0) {
        if (in_RDI[6].ptr == in_RDI[2].ptr) {
          in_RDI[6].ptr = (data_ptr_t)0x0;
          pdVar1 = in_RDI[5].ptr;
          in_RDI[5].ptr = pdVar1 + 1;
          if (pdVar1 + 1 == (data_ptr_t)in_RDI[1].len) {
            ParquetDecodeUtils::VarintDecode<unsigned_long,true>((ByteBuffer *)0x0);
            uVar3 = ParquetDecodeUtils::ZigzagToInt<unsigned_long>((unsigned_long)in_RDI);
            in_RDI[4].len = uVar3;
            ByteBuffer::available
                      (in_stack_ffffffffffffffc0,
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
            in_RDI[5].len = (uint64_t)in_RDI->ptr;
            ByteBuffer::unsafe_inc(in_RDI,in_RDI[1].len);
            in_RDI[5].ptr = (data_ptr_t)0x0;
          }
        }
        ParquetDecodeUtils::BitUnpackAligned<unsigned_long>
                  (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (bitpacking_width_t)((ulong)pBVar5 >> 0x38));
        in_RDI[0x16].len = 0;
        in_RDI[6].ptr = in_RDI[6].ptr + 0x20;
      }
      else {
        for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
          in_stack_ffffffffffffffc0 = (ByteBuffer *)(&in_RDI[6].len + in_RDI[0x16].len + local_38);
          in_stack_ffffffffffffffbc =
               (int)in_RDI[3].ptr + (int)in_RDI[4].len + (int)in_stack_ffffffffffffffc0->ptr;
          in_RDI[3].ptr = (data_ptr_t)(long)in_stack_ffffffffffffffbc;
        }
        local_28 = uVar2 + local_28;
        in_RDI[0x16].len = uVar2 + in_RDI[0x16].len;
      }
    }
  }
  return;
}

Assistant:

void GetBatchInternal(const data_ptr_t target_values_ptr, const idx_t batch_size) {
		if (batch_size == 0) {
			return;
		}
		D_ASSERT(target_values_ptr || SKIP_READ);

		T *target_values = nullptr;
		if (!SKIP_READ) {
			target_values = reinterpret_cast<T *>(target_values_ptr);
		}
		idx_t target_values_offset = 0;
		if (is_first_value) {
			if (!SKIP_READ) {
				target_values[0] = static_cast<T>(previous_value);
			}
			target_values_offset++;
			is_first_value = false;
		}

		while (target_values_offset < batch_size) {
			// Copy over any remaining data
			const idx_t next = MinValue(batch_size - target_values_offset,
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - unpacked_data_offset);
			if (next != 0) {
				for (idx_t i = 0; i < next; i++) {
					const auto &unpacked_value = unpacked_data[unpacked_data_offset + i];
					auto current_value = static_cast<T>(static_cast<uint64_t>(previous_value) +
					                                    static_cast<uint64_t>(min_delta) + unpacked_value);
					if (!SKIP_READ) {
						target_values[target_values_offset + i] = current_value;
					}
					previous_value = static_cast<int64_t>(current_value);
				}
				target_values_offset += next;
				unpacked_data_offset += next;
				continue;
			}

			// Move to next miniblock / block
			D_ASSERT(unpacked_data_offset == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
			D_ASSERT(miniblock_index < number_of_miniblocks_per_block);
			D_ASSERT(miniblock_offset <= number_of_values_in_a_miniblock);
			if (miniblock_offset == number_of_values_in_a_miniblock) {
				miniblock_offset = 0;
				if (++miniblock_index == number_of_miniblocks_per_block) {
					// <min delta> <list of bitwidths of miniblocks> <miniblocks>
					min_delta = ParquetDecodeUtils::ZigzagToInt(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_));
					buffer_.available(number_of_miniblocks_per_block);
					list_of_bitwidths_of_miniblocks = buffer_.ptr;
					buffer_.unsafe_inc(number_of_miniblocks_per_block);
					miniblock_index = 0;
				}
			}

			// Unpack from current miniblock
			ParquetDecodeUtils::BitUnpackAligned(buffer_, unpacked_data,
			                                     BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE,
			                                     list_of_bitwidths_of_miniblocks[miniblock_index]);
			unpacked_data_offset = 0;
			miniblock_offset += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}